

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::Flatten
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          *list)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  int i;
  long i_00;
  MessageGenerator *local_28;
  
  for (i_00 = 0; i_00 < *(int *)(this->descriptor_ + 0x48); i_00 = i_00 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,i_00);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (this_00);
    Flatten(this_01,list);
  }
  this->index_in_file_messages_ =
       (int)((ulong)((long)(list->
                           super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(list->
                          super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_28 = this;
  std::
  vector<google::protobuf::compiler::cpp::MessageGenerator*,std::allocator<google::protobuf::compiler::cpp::MessageGenerator*>>
  ::emplace_back<google::protobuf::compiler::cpp::MessageGenerator*>
            ((vector<google::protobuf::compiler::cpp::MessageGenerator*,std::allocator<google::protobuf::compiler::cpp::MessageGenerator*>>
              *)list,&local_28);
  return;
}

Assistant:

void MessageGenerator::Flatten(std::vector<MessageGenerator*>* list) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->Flatten(list);
  }
  index_in_file_messages_ = list->size();
  list->push_back(this);
}